

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::unit_to_the_power_of(string *unit_string,int power,uint64_t match_flags)

{
  unit_data *this;
  pointer pcVar1;
  precise_unit pVar2;
  int power_00;
  unit_data uVar3;
  undefined4 extraout_EAX;
  unit_data extraout_EAX_00;
  long lVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  uint64_t match_flags_00;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  bool bVar9;
  double dVar10;
  double in_XMM1_Qa;
  precise_unit pVar11;
  int index;
  string ustring;
  precise_unit a_unit;
  double local_110;
  precise_unit local_108;
  double local_f8;
  double local_f0;
  int local_e4;
  string local_e0;
  precise_unit local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f8 = (double)CONCAT44(local_f8._4_4_,power);
  uVar6 = ~(uint)match_flags >> 2 & 0x8000;
  local_108.base_units_ = (unit_data)0xfa94a488;
  local_108.commodity_ = 0;
  local_108.multiplier_ = NAN;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  local_e4 = (int)unit_string->_M_string_length + -2;
  if (pcVar1[unit_string->_M_string_length - 1] != ')') {
LAB_0017a397:
    if (((uint)match_flags >> 9 & 1) != 0) {
      cleanUnitString(unit_string,match_flags);
    }
    local_108 = get_unit(unit_string,match_flags);
    dVar10 = local_108.multiplier_;
    if (local_108.base_units_ == (unit_data)0xfa94a488 && NAN(dVar10)) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"per","");
      sVar5 = findWordOperatorSep(unit_string,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (sVar5 == 0xffffffffffffffff) {
        pcVar1 = (unit_string->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
        local_108 = unit_from_string_internal(&local_70,match_flags - uVar6);
        iVar7 = local_f8._0_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        dVar10 = local_108.multiplier_;
        if ((NAN(dVar10)) && (local_108.base_units_ == -0x56b5b78)) {
          local_108.base_units_ = (unit_data)0xfa94a488;
          local_108.commodity_ = 0;
          local_108.multiplier_ = NAN;
        }
        else if (iVar7 == -1) {
          local_108 = precise_unit::inv(&local_108);
        }
        else if (iVar7 == 1) {
          local_108.multiplier_ = dVar10;
        }
        else {
          dVar10 = precise_unit::pow(&local_108,dVar10,dVar10);
          local_108.base_units_ = (unit_data)(int)extraout_RAX;
          local_108.commodity_ = (int)((ulong)extraout_RAX >> 0x20);
          local_108.multiplier_ = dVar10;
        }
      }
      else {
        local_108.base_units_ = (unit_data)0x30000000;
        local_108.commodity_ = 0;
        local_108.multiplier_ = 1.0;
      }
    }
    else if (local_f8._0_4_ != 1) {
      if (local_f8._0_4_ == -1) {
        uVar3 = detail::unit_data::inv(&local_108.base_units_);
        uVar6 = ~local_108.commodity_;
        if (local_108.commodity_ == 0) {
          uVar6 = 0;
        }
        local_108.commodity_ = uVar6;
        local_108.base_units_ = uVar3;
        local_108.multiplier_ = 1.0 / dVar10;
      }
      else {
        dVar10 = detail::power_const<double>(dVar10,local_f8._0_4_);
        detail::unit_data::pow(&local_108.base_units_,dVar10,in_XMM1_Qa);
        local_108.base_units_ = (unit_data)extraout_EAX;
        local_108.multiplier_ = dVar10;
      }
    }
    return local_108;
  }
  segmentcheckReverse(unit_string,'(',&local_e4);
  iVar7 = local_e4;
  if ((0 < (long)local_e4) && (pcVar1[local_e4] == '^')) goto LAB_0017a397;
  std::__cxx11::string::substr((ulong)&local_e0,(ulong)unit_string);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  match_flags_00 = match_flags - uVar6;
  local_108 = unit_from_string_internal(&local_90,match_flags_00);
  power_00 = local_f8._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_f0 = local_108.multiplier_;
  if ((NAN(local_f0)) && (local_108.base_units_ == -0x56b5b78)) {
    uVar8._0_4_ = (unit_data)0xfa94a488;
    uVar8._4_4_ = 0;
    local_110 = NAN;
    if ((iVar7 < 0) ||
       (lVar4 = std::__cxx11::string::find_first_of((char *)&local_e0,0x191368,0), lVar4 != -1))
    goto LAB_0017a843;
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + unit_string->_M_string_length);
    local_108 = unit_from_string_internal(&local_b0,match_flags_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_f0 = local_108.multiplier_;
    iVar7 = -1;
    if ((NAN(local_f0)) && (local_108.base_units_ == -0x56b5b78)) goto LAB_0017a843;
  }
  this = &local_108.base_units_;
  if (power_00 == 1) {
    local_110 = local_f0;
  }
  else {
    if (power_00 == -1) {
      uVar3 = detail::unit_data::inv(this);
      bVar9 = local_108.commodity_ == 0;
      local_108.commodity_ = ~local_108.commodity_;
      if (bVar9) {
        local_108.commodity_ = 0;
      }
      local_110 = 1.0 / local_f0;
    }
    else {
      local_110 = detail::power_const<double>(local_f0,power_00);
      detail::unit_data::pow(this,local_110,in_XMM1_Qa);
      uVar3 = extraout_EAX_00;
    }
    local_108.base_units_ = uVar3;
    local_108.multiplier_ = local_110;
  }
  if (iVar7 < 0) {
    uVar8 = local_108._8_8_;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)unit_string);
    pVar11 = unit_from_string_internal(&local_50,match_flags_00);
    local_c0 = pVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pVar11.base_units_ == (unit_data)0xfa94a488 || NAN(pVar11.multiplier_)) {
      uVar8._0_4_ = (unit_data)0x30000000;
      uVar8._4_4_ = 0;
      local_110 = 1.0;
    }
    else {
      local_f8 = local_108.multiplier_;
      uVar3 = detail::unit_data::operator*(&local_c0.base_units_,this);
      local_110 = pVar11.multiplier_ * local_f8;
      uVar8._4_4_ = local_108.commodity_ | local_c0.commodity_;
      uVar8._0_4_ = uVar3;
    }
  }
LAB_0017a843:
  pVar2.base_units_ = SUB84(uVar8,0);
  pVar2.commodity_ = SUB84(uVar8,4);
  pVar2.multiplier_ = local_110;
  pVar11.base_units_ = SUB84(uVar8,0);
  pVar11.commodity_ = SUB84(uVar8,4);
  pVar11.multiplier_ = local_110;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
    return pVar11;
  }
  operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  return pVar2;
}

Assistant:

static precise_unit unit_to_the_power_of(
    std::string unit_string,
    int power,
    std::uint64_t match_flags)
{
    std::uint32_t recursion_modifier = recursion_depth1;
    if ((match_flags & no_recursion) != 0) {
        recursion_modifier = 0;
    }

    precise_unit retunit = precise::invalid;
    bool partialPowerSegment = (unit_string.back() == ')');
    int index = static_cast<int>(unit_string.size() - 2);
    if (partialPowerSegment) {
        segmentcheckReverse(unit_string, '(', index);
        if (index > 0 && unit_string[index] == '^') {
            partialPowerSegment = false;
        }
    }
    if (partialPowerSegment) {
        std::string ustring = unit_string.substr(
            static_cast<size_t>(index) + 2,
            unit_string.size() - static_cast<size_t>(index) - 3);
        retunit = unit_from_string_internal(
            ustring, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            if (index >= 0) {
                if (ustring.find_first_of("(*/^{[") == std::string::npos) {
                    retunit = unit_from_string_internal(
                        unit_string, match_flags - recursion_modifier);
                    if (!is_valid(retunit)) {
                        return precise::invalid;
                    }
                    index = -1;
                } else {
                    return precise::invalid;
                }
            } else {
                return precise::invalid;
            }
        }

        if (power == -1) {
            retunit = retunit.inv();
        } else if (power != 1) {
            retunit = retunit.pow(power);
        }

        if (index < 0) {
            return retunit;
        }
        auto a_unit = unit_from_string_internal(
            unit_string.substr(0, index), match_flags - recursion_modifier);
        if (!is_error(a_unit)) {
            return a_unit * retunit;
        }
        return precise::defunit;
    }
    // auto ustring = unit_string.substr(0, pchar + 1);

    if ((match_flags & case_insensitive) != 0) {
        cleanUnitString(unit_string, match_flags);
    }

    retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    auto fnd = findWordOperatorSep(unit_string, "per");
    if (fnd == std::string::npos) {
        retunit = unit_from_string_internal(
            unit_string, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            return precise::invalid;
        }
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    return precise::defunit;
}